

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ModuleHeaderSyntax * __thiscall slang::parsing::Parser::parseModuleHeader(Parser *this)

{
  Token name;
  bool bVar1;
  int iVar2;
  SyntaxKind kind;
  undefined8 uVar3;
  PackageImportDeclarationSyntax *parameters;
  undefined8 uVar4;
  PackageImportDeclarationSyntax *ports;
  undefined8 uVar5;
  NonAnsiPortSyntax *pNVar6;
  undefined4 extraout_var;
  SourceLocation SVar7;
  ModuleHeaderSyntax *pMVar8;
  __extent_storage<18446744073709551615UL> _Var9;
  Info *extraout_RDX;
  Info *src;
  TokenKind kind_00;
  PackageImportDeclarationSyntax *this_00;
  ulong uVar10;
  Token openParen;
  Token TVar11;
  Token TVar12;
  span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> sVar13;
  Token TVar14;
  Token TVar15;
  SourceRange range;
  Token moduleKeyword;
  Token lifetime;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Info *local_1f8;
  Token local_1e0;
  Info *local_1d0;
  pointer local_1c8;
  Info *local_1c0;
  Info *local_1b8;
  undefined8 local_1b0;
  Info *local_1a8;
  undefined8 local_1a0;
  Info *local_198;
  Token local_190;
  undefined8 local_180;
  Info *pIStack_178;
  Token local_170;
  Token local_160;
  Token local_150;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_140;
  ulong local_130;
  undefined8 uStack_128;
  undefined8 local_118;
  undefined1 local_108 [24];
  undefined1 auStack_f0 [24];
  __extent_storage<18446744073709551615UL> local_d8;
  
  TVar11 = ParserBase::consume(&this->super_ParserBase);
  local_198 = TVar11.info;
  uVar3 = TVar11._0_8_;
  TVar12 = parseLifetime(this);
  local_1a8 = TVar12.info;
  local_1a0 = TVar12._0_8_;
  TVar12 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1b8 = TVar12.info;
  local_1b0 = TVar12._0_8_;
  sVar13 = parsePackageImports(this);
  _Var9 = sVar13._M_extent._M_extent_value;
  local_1c8 = sVar13._M_ptr;
  parameters = (PackageImportDeclarationSyntax *)parseParameterPortList(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  TVar12.info = local_150.info;
  TVar12.kind = local_150.kind;
  TVar12._2_1_ = local_150._2_1_;
  TVar12.numFlags.raw = local_150.numFlags.raw;
  TVar12.rawLen = local_150.rawLen;
  if (bVar1) {
    TVar12 = ParserBase::consume(&this->super_ParserBase);
    uVar4 = TVar12._0_8_;
    bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
    if ((bVar1) && (TVar14 = ParserBase::peek(&this->super_ParserBase,1), TVar14.kind == Star)) {
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      local_160 = ParserBase::consume(&this->super_ParserBase);
      local_170 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      ports = (PackageImportDeclarationSyntax *)
              slang::syntax::SyntaxFactory::wildcardPortList
                        (&this->factory,TVar12,TVar14,local_160,local_170);
    }
    else {
      bVar1 = isNonAnsiPort(this);
      if (bVar1) {
        local_1c0 = TVar12.info;
        Token::Token(&local_1e0);
        local_108._8_8_ = 0;
        local_108._0_8_ = auStack_f0;
        local_108._16_8_ = (SyntaxNode *)0x8;
        TVar14 = ParserBase::peek(&this->super_ParserBase);
        local_150 = TVar14;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar14.kind);
        if (bVar1) {
          bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
          if (!bVar1) {
            SVar7 = Token::location(&local_150);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x480005,SVar7);
          }
          local_1e0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_0065a071:
          src = local_1e0.info;
        }
        else {
          bVar1 = slang::syntax::SyntaxFacts::isPossibleNonAnsiPort(TVar14.kind);
          if (bVar1) {
            local_140._M_rest =
                 (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseNonAnsiPort(this);
            local_130 = CONCAT71(local_130._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                       (TokenOrSyntax *)&local_140._M_first);
            TVar12 = ParserBase::peek(&this->super_ParserBase);
            uVar5 = TVar12._0_8_;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
            if (TVar12.kind != EndOfFile && !bVar1) {
              do {
                local_1f8 = TVar14.info;
                if ((short)uVar5 != 0x18) {
                  ParserBase::expect(&this->super_ParserBase,Comma);
                  do {
                    bVar1 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                      (&this->super_ParserBase,(DiagCode)0x480005,false);
                    if (!bVar1) {
                      local_1e0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                      goto LAB_0065a071;
                    }
                    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                  } while (!bVar1);
                }
                local_140._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     ParserBase::expect(&this->super_ParserBase,Comma);
                local_130 = local_130 & 0xffffffffffffff00;
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (TokenOrSyntax *)&local_140._M_first);
                TVar12 = ParserBase::peek(&this->super_ParserBase);
                local_1d0 = TVar12.info;
                kind_00 = TVar12.kind;
                bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(kind_00);
                if (kind_00 == EndOfFile || bVar1) {
                  pNVar6 = parseNonAnsiPort(this);
                  local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar6;
                  local_130 = CONCAT71(local_130._1_7_,1);
                  SmallVectorBase<slang::syntax::TokenOrSyntax>::
                  emplace_back<slang::syntax::TokenOrSyntax>
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                             (TokenOrSyntax *)&local_140._M_first);
                  break;
                }
                if (local_1f8 == local_1d0 && TVar14.kind == kind_00) {
                  bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x480005,true);
                  if (!bVar1) break;
                }
                pNVar6 = parseNonAnsiPort(this);
                local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar6;
                local_130 = CONCAT71(local_130._1_7_,1);
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (TokenOrSyntax *)&local_140._M_first);
                TVar15 = ParserBase::peek(&this->super_ParserBase);
                uVar5 = TVar15._0_8_;
                bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar15.kind);
                uVar10 = TVar12._0_8_ & 0xffffffff;
                TVar14.info = local_1d0;
                TVar14.kind = (short)uVar10;
                TVar14._2_1_ = (char)(uVar10 >> 0x10);
                TVar14.numFlags.raw = (char)(uVar10 >> 0x18);
                TVar14.rawLen = (int)(uVar10 >> 0x20);
              } while (TVar15.kind != EndOfFile && !bVar1);
            }
            local_1e0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
            goto LAB_0065a071;
          }
          ParserBase::reportMissingList
                    (&this->super_ParserBase,TVar14,CloseParenthesis,&local_1e0,(DiagCode)0x480005);
          src = extraout_RDX;
        }
        iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
        local_118 = CONCAT44(extraout_var,iVar2);
        local_140._8_4_ = 3;
        local_130 = 0;
        uStack_128 = 0;
        local_140._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00c95968;
        openParen.info = local_1c0;
        openParen.kind = (short)uVar4;
        openParen._2_1_ = (char)((ulong)uVar4 >> 0x10);
        openParen.numFlags.raw = (char)((ulong)uVar4 >> 0x18);
        openParen.rawLen = (int)((ulong)uVar4 >> 0x20);
        ports = (PackageImportDeclarationSyntax *)
                slang::syntax::SyntaxFactory::nonAnsiPortList
                          (&this->factory,openParen,
                           (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)
                           &local_140._M_first,local_1e0);
        if ((pointer)local_108._0_8_ != (pointer)auStack_f0) {
          operator_delete((void *)local_108._0_8_);
        }
        goto LAB_0065a0f9;
      }
      ports = (PackageImportDeclarationSyntax *)parseAnsiPortList(this,TVar12);
    }
  }
  else {
    ports = (PackageImportDeclarationSyntax *)0x0;
    local_150 = TVar12;
  }
LAB_0065a0f9:
  if ((TVar11._0_4_ & 0xffff) == 0xe8) {
    if (_Var9._M_extent_value == 0) {
      this_00 = parameters;
      if ((parameters == (PackageImportDeclarationSyntax *)0x0) &&
         (this_00 = ports, ports == (PackageImportDeclarationSyntax *)0x0)) goto LAB_0065a179;
    }
    else {
      this_00 = *local_1c8;
    }
    range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x700005,range);
  }
  else if ((parameters == (PackageImportDeclarationSyntax *)0x0 &&
           ports == (PackageImportDeclarationSyntax *)0x0) && _Var9._M_extent_value != 0) {
    local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
    SVar7 = Token::location((Token *)local_108);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4e0005,SVar7);
  }
LAB_0065a179:
  TVar12 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  kind = slang::syntax::SyntaxFacts::getModuleHeaderKind(TVar11.kind);
  local_180 = local_1b0;
  pIStack_178 = local_1b8;
  local_108._8_4_ = 1;
  local_108._16_8_ = (SyntaxNode *)0x0;
  auStack_f0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_f0._16_8_ = local_1c8;
  local_108._0_8_ = &PTR_getChild_00c958e0;
  name.info = local_1b8;
  name.kind = (undefined2)local_1b0;
  name._2_1_ = local_1b0._2_1_;
  name.numFlags.raw = local_1b0._3_1_;
  name.rawLen = local_1b0._4_4_;
  moduleKeyword.info = local_198;
  moduleKeyword.kind = (short)uVar3;
  moduleKeyword._2_1_ = (char)((ulong)uVar3 >> 0x10);
  moduleKeyword.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  moduleKeyword.rawLen = (int)((ulong)uVar3 >> 0x20);
  lifetime.info = local_1a8;
  lifetime.kind = (undefined2)local_1a0;
  lifetime._2_1_ = local_1a0._2_1_;
  lifetime.numFlags.raw = local_1a0._3_1_;
  lifetime.rawLen = local_1a0._4_4_;
  local_190 = TVar12;
  auStack_f0._8_8_ = _Var9._M_extent_value;
  local_d8._M_extent_value = _Var9._M_extent_value;
  pMVar8 = slang::syntax::SyntaxFactory::moduleHeader
                     (&this->factory,kind,moduleKeyword,lifetime,name,
                      (SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)local_108,
                      (ParameterPortListSyntax *)parameters,(PortListSyntax *)ports,TVar12);
  return pMVar8;
}

Assistant:

ModuleHeaderSyntax& Parser::parseModuleHeader() {
    auto moduleKeyword = consume();
    auto lifetime = parseLifetime();
    auto name = expect(TokenKind::Identifier);
    auto imports = parsePackageImports();
    auto parameterList = parseParameterPortList();

    PortListSyntax* ports = nullptr;
    if (peek(TokenKind::OpenParenthesis)) {
        auto openParen = consume();
        if (peek(TokenKind::Dot) && peek(1).kind == TokenKind::Star) {
            auto dot = consume();
            auto star = consume();
            ports = &factory.wildcardPortList(openParen, dot, star,
                                              expect(TokenKind::CloseParenthesis));
        }
        else if (isNonAnsiPort()) {
            Token closeParen;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleNonAnsiPort, isEndOfParenList>(
                buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen,
                RequireItems::True, diag::ExpectedNonAnsiPort,
                [this] { return &parseNonAnsiPort(); }, AllowEmpty::True);
            ports = &factory.nonAnsiPortList(openParen, buffer.copy(alloc), closeParen);
        }
        else {
            ports = &parseAnsiPortList(openParen);
        }
    }

    if (moduleKeyword.kind == TokenKind::PackageKeyword) {
        std::optional<SourceRange> errorRange;
        if (!imports.empty())
            errorRange = imports[0]->sourceRange();
        else if (parameterList)
            errorRange = parameterList->sourceRange();
        else if (ports)
            errorRange = ports->sourceRange();

        if (errorRange)
            addDiag(diag::InvalidPackageDecl, *errorRange);
    }
    else if (!imports.empty() && !parameterList && !ports) {
        addDiag(diag::ExpectedPortList, peek().location());
    }

    auto semi = expect(TokenKind::Semicolon);
    return factory.moduleHeader(getModuleHeaderKind(moduleKeyword.kind), moduleKeyword, lifetime,
                                name, imports, parameterList, ports, semi);
}